

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O2

void av1_write_coeffs_txb
               (AV1_COMMON *cm,MACROBLOCK *x,aom_writer *w,int blk_row,int blk_col,int plane,
               int block,TX_SIZE tx_size)

{
  tran_low_t *ptVar1;
  TX_CLASS tx_class;
  ushort eob;
  short sVar2;
  CB_COEFF_BUFFER *pCVar3;
  FRAME_CONTEXT *pFVar4;
  int16_t *scan;
  aom_cdf_prob (*paaaVar5) [21] [5];
  byte bVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  aom_cdf_prob (*cdf) [12];
  aom_cdf_prob (*cdf_00) [5];
  uint uVar13;
  uint uVar14;
  uint symb;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  int eob_extra;
  long local_1588;
  uint8_t *local_1580;
  aom_cdf_prob (*local_1578) [2] [21] [5];
  ulong local_1570;
  aom_cdf_prob (*local_1568) [2] [4] [4];
  aom_cdf_prob (*local_1560) [2] [42] [5];
  uint8_t levels_buf [1312];
  int8_t coeff_contexts [4096];
  
  pCVar3 = x->cb_coef_buff;
  bVar23 = plane != 0;
  uVar21 = (ulong)(x->mbmi_ext_frame->cb_offset[bVar23] >> 4);
  uVar20 = (ulong)tx_size;
  local_1588 = (long)block;
  eob = pCVar3->eobs[plane][uVar21 + local_1588];
  local_1580 = pCVar3->entropy_ctx[plane] + uVar21;
  uVar10 = (uint)""[uVar20] + (uint)""[uVar20] + 1 >> 1;
  uVar11 = uVar10 & 0xff;
  pFVar4 = (x->e_mbd).tile_ctx;
  aom_write_symbol(w,(uint)(eob == 0),pFVar4->txb_skip_cdf[uVar11][local_1580[local_1588] & 0xf],2);
  if (eob != 0) {
    bVar6 = av1_get_tx_type(&x->e_mbd,plane != 0,blk_row,blk_col,tx_size,
                            (uint)(cm->features).reduced_tx_set_used);
    if (plane == 0) {
      av1_write_tx_type(cm,&x->e_mbd,bVar6,tx_size,w);
    }
    iVar7 = av1_get_eob_pos_token((uint)eob,&eob_extra);
    bVar22 = 9 < bVar6;
    tx_class = ""[bVar6];
    switch(""[uVar20]) {
    case '\0':
      cdf = (aom_cdf_prob (*) [12])(pFVar4->eob_flag_cdf16[bVar23] + bVar22);
      iVar8 = 5;
      break;
    case '\x01':
      cdf = (aom_cdf_prob (*) [12])(pFVar4->eob_flag_cdf32[bVar23] + bVar22);
      iVar8 = 6;
      break;
    case '\x02':
      cdf = (aom_cdf_prob (*) [12])(pFVar4->eob_flag_cdf64[bVar23] + bVar22);
      iVar8 = 7;
      break;
    case '\x03':
      cdf = (aom_cdf_prob (*) [12])(pFVar4->eob_flag_cdf128[bVar23] + bVar22);
      iVar8 = 8;
      break;
    case '\x04':
      cdf = (aom_cdf_prob (*) [12])(pFVar4->eob_flag_cdf256[bVar23] + bVar22);
      iVar8 = 9;
      break;
    case '\x05':
      cdf = (aom_cdf_prob (*) [12])(pFVar4->eob_flag_cdf512[bVar23] + bVar22);
      iVar8 = 10;
      break;
    default:
      cdf = pFVar4->eob_flag_cdf1024[bVar23] + bVar22;
      iVar8 = 0xb;
    }
    aom_write_symbol(w,iVar7 + -1,*cdf,iVar8);
    sVar2 = av1_eob_offset_bits[iVar7];
    if (0 < sVar2) {
      aom_write_symbol(w,(uint)(((uint)eob_extra >> ((int)sVar2 - 1U & 0x1f) & 1) != 0),
                       pFVar4->eob_extra_cdf[uVar11][bVar23][iVar7 + -3],2);
      for (uVar18 = (int)sVar2 - 2; uVar18 != 0xffffffff; uVar18 = uVar18 - 1) {
        aom_write_bit(w,(uint)(((uint)eob_extra >> (uVar18 & 0x1f) & 1) != 0));
      }
    }
    iVar7 = get_txb_wide(tx_size);
    iVar8 = get_txb_high(tx_size);
    ptVar1 = pCVar3->tcoeff[plane] +
             (ulong)x->mbmi_ext_frame->cb_offset[bVar23] + (long)(block << 4);
    (*av1_txb_init_levels)(ptVar1,iVar7,iVar8,levels_buf);
    scan = av1_scan_orders[tx_size][bVar6].scan;
    av1_get_nz_map_contexts_sse2(levels_buf,scan,eob,tx_size,tx_class,coeff_contexts);
    iVar7 = get_txb_bhl(tx_size);
    bVar9 = (byte)iVar7;
    iVar7 = 1 << (bVar9 & 0x1f);
    local_1560 = pFVar4->coeff_base_cdf;
    local_1568 = pFVar4->coeff_base_eob_cdf;
    local_1570 = (ulong)(iVar7 + 4);
    bVar6 = (byte)uVar10;
    if (2 < bVar6) {
      bVar6 = 3;
    }
    local_1578 = pFVar4->coeff_br_cdf + bVar6;
    for (uVar10 = eob - 1; uVar18 = 3, -1 < (int)uVar10; uVar10 = uVar10 - 1) {
      sVar2 = scan[uVar10];
      uVar14 = ptVar1[sVar2];
      uVar19 = -uVar14;
      uVar13 = uVar14;
      if ((int)uVar14 < 1) {
        uVar13 = uVar19;
      }
      symb = uVar18;
      if (uVar13 < 3) {
        symb = uVar13;
      }
      if (uVar10 == eob - 1) {
        symb = symb - 1;
        cdf_00 = (aom_cdf_prob (*) [5])
                 ((long)(*local_1568)[bVar23][coeff_contexts[sVar2]] + (ulong)(uVar11 << 6));
      }
      else {
        cdf_00 = local_1560[uVar11][bVar23] + coeff_contexts[sVar2];
        uVar18 = 4;
      }
      aom_write_symbol(w,symb,*cdf_00,uVar18);
      if (2 < uVar13) {
        iVar12 = (int)sVar2 >> (bVar9 & 0x1f);
        iVar15 = iVar12 << (bVar9 & 0x1f);
        iVar8 = sVar2 - iVar15;
        iVar16 = iVar12 * (int)local_1570 + iVar8;
        lVar17 = (long)((int)local_1570 + iVar16);
        uVar18 = (uint)levels_buf[lVar17] + (uint)levels_buf[(long)iVar16 + 1];
        if (tx_class == '\x02') {
          uVar18 = uVar18 + levels_buf[(long)iVar16 + 2] + 1 >> 1;
          if (5 < uVar18) {
            uVar18 = 6;
          }
          if (sVar2 != 0) {
            if (sVar2 != iVar15) goto LAB_001afaae;
LAB_001afad6:
            uVar18 = uVar18 + 7;
          }
        }
        else {
          if (tx_class == '\x01') {
            uVar18 = uVar18 + levels_buf[iVar16 + iVar7 * 2 + 8] + 1 >> 1;
            if (5 < uVar18) {
              uVar18 = 6;
            }
            if (sVar2 == 0) goto LAB_001afad9;
            if (iVar12 == 0) goto LAB_001afad6;
          }
          else if (tx_class == '\0') {
            uVar18 = uVar18 + levels_buf[lVar17 + 1] + 1 >> 1;
            if (5 < uVar18) {
              uVar18 = 6;
            }
            if (sVar2 == 0) goto LAB_001afad9;
            if (iVar12 < 2 && iVar8 < 2) goto LAB_001afad6;
          }
LAB_001afaae:
          uVar18 = uVar18 + 0xe;
        }
LAB_001afad9:
        paaaVar5 = *local_1578;
        if (uVar14 != uVar19 && SBORROW4(uVar14,uVar19) == (int)(uVar14 * 2) < 0) {
          uVar19 = uVar14;
        }
        uVar14 = 0;
        do {
          if (0xb < uVar14) break;
          uVar19 = uVar19 - 3;
          uVar13 = 3;
          if ((int)uVar19 < 3) {
            uVar13 = uVar19;
          }
          aom_write_symbol(w,uVar13,paaaVar5[bVar23][uVar18],4);
          uVar14 = uVar14 + 3;
        } while (2 < (int)uVar19);
      }
    }
    for (uVar21 = 0; uVar21 != eob; uVar21 = uVar21 + 1) {
      uVar10 = ptVar1[scan[uVar21]];
      uVar11 = -uVar10;
      if (0 < (int)uVar10) {
        uVar11 = uVar10;
      }
      if (uVar10 != 0) {
        if (uVar21 == 0) {
          aom_write_symbol(w,uVar10 >> 0x1f,
                           pFVar4->dc_sign_cdf[bVar23][local_1580[local_1588] >> 4 & 3],2);
        }
        else {
          aom_write_bit(w,uVar10 >> 0x1f);
        }
        if (0xe < uVar11) {
          uVar18 = 0xffffffff;
          for (uVar10 = uVar11 - 0xe; uVar10 != 0; uVar10 = uVar10 >> 1) {
            uVar18 = uVar18 + 1;
          }
          uVar10 = 0;
          if (0 < (int)uVar18) {
            uVar10 = uVar18;
          }
          while (bVar22 = uVar10 != 0, uVar10 = uVar10 - 1, bVar22) {
            aom_write_bit(w,0);
          }
          for (; 0 < (int)(uVar18 + 1); uVar18 = uVar18 - 1) {
            aom_write_bit(w,(uint)((uVar11 - 0xe >> (uVar18 & 0x1f) & 1) != 0));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void av1_write_coeffs_txb(const AV1_COMMON *const cm, MACROBLOCK *const x,
                          aom_writer *w, int blk_row, int blk_col, int plane,
                          int block, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  const CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                         (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
  const uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
  const uint16_t eob = eob_txb[block];
  const uint8_t *entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
  const int txb_skip_ctx = entropy_ctx[block] & TXB_SKIP_CTX_MASK;
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  aom_write_symbol(w, eob == 0, ec_ctx->txb_skip_cdf[txs_ctx][txb_skip_ctx], 2);
  if (eob == 0) return;

  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  // Only y plane's tx_type is transmitted
  if (plane == 0) {
    av1_write_tx_type(cm, xd, tx_type, tx_size, w);
  }

  int eob_extra;
  const int eob_pt = av1_get_eob_pos_token(eob, &eob_extra);
  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const TX_CLASS tx_class = tx_type_to_class[tx_type];
  const int eob_multi_ctx = (tx_class == TX_CLASS_2D) ? 0 : 1;
  switch (eob_multi_size) {
    case 0:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf16[plane_type][eob_multi_ctx], 5);
      break;
    case 1:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf32[plane_type][eob_multi_ctx], 6);
      break;
    case 2:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf64[plane_type][eob_multi_ctx], 7);
      break;
    case 3:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf128[plane_type][eob_multi_ctx], 8);
      break;
    case 4:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf256[plane_type][eob_multi_ctx], 9);
      break;
    case 5:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf512[plane_type][eob_multi_ctx], 10);
      break;
    default:
      aom_write_symbol(w, eob_pt - 1,
                       ec_ctx->eob_flag_cdf1024[plane_type][eob_multi_ctx], 11);
      break;
  }

  const int eob_offset_bits = av1_eob_offset_bits[eob_pt];
  if (eob_offset_bits > 0) {
    const int eob_ctx = eob_pt - 3;
    int eob_shift = eob_offset_bits - 1;
    int bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
    aom_write_symbol(w, bit,
                     ec_ctx->eob_extra_cdf[txs_ctx][plane_type][eob_ctx], 2);
    for (int i = 1; i < eob_offset_bits; i++) {
      eob_shift = eob_offset_bits - 1 - i;
      bit = (eob_extra & (1 << eob_shift)) ? 1 : 0;
      aom_write_bit(w, bit);
    }
  }

  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  uint8_t levels_buf[TX_PAD_2D];
  uint8_t *const levels = set_levels(levels_buf, height);
  const tran_low_t *tcoeff_txb =
      cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
  const tran_low_t *tcoeff = tcoeff_txb + BLOCK_OFFSET(block);
  av1_txb_init_levels(tcoeff, width, height, levels);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  const int16_t *const scan = scan_order->scan;
  DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
  av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class, coeff_contexts);

  const int bhl = get_txb_bhl(tx_size);
  for (int c = eob - 1; c >= 0; --c) {
    const int pos = scan[c];
    const int coeff_ctx = coeff_contexts[pos];
    const tran_low_t v = tcoeff[pos];
    const tran_low_t level = abs(v);

    if (c == eob - 1) {
      aom_write_symbol(
          w, AOMMIN(level, 3) - 1,
          ec_ctx->coeff_base_eob_cdf[txs_ctx][plane_type][coeff_ctx], 3);
    } else {
      aom_write_symbol(w, AOMMIN(level, 3),
                       ec_ctx->coeff_base_cdf[txs_ctx][plane_type][coeff_ctx],
                       4);
    }
    if (level > NUM_BASE_LEVELS) {
      // level is above 1.
      const int base_range = level - 1 - NUM_BASE_LEVELS;
      const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
      aom_cdf_prob *cdf =
          ec_ctx->coeff_br_cdf[AOMMIN(txs_ctx, TX_32X32)][plane_type][br_ctx];
      for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
        const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
        aom_write_symbol(w, k, cdf, BR_CDF_SIZE);
        if (k < BR_CDF_SIZE - 1) break;
      }
    }
  }

  // Loop to code all signs in the transform block,
  // starting with the sign of DC (if applicable)
  for (int c = 0; c < eob; ++c) {
    const tran_low_t v = tcoeff[scan[c]];
    const tran_low_t level = abs(v);
    const int sign = (v < 0) ? 1 : 0;
    if (level) {
      if (c == 0) {
        const int dc_sign_ctx =
            (entropy_ctx[block] >> DC_SIGN_CTX_SHIFT) & DC_SIGN_CTX_MASK;
        aom_write_symbol(w, sign, ec_ctx->dc_sign_cdf[plane_type][dc_sign_ctx],
                         2);
      } else {
        aom_write_bit(w, sign);
      }
      if (level > COEFF_BASE_RANGE + NUM_BASE_LEVELS)
        write_golomb(w, level - COEFF_BASE_RANGE - 1 - NUM_BASE_LEVELS);
    }
  }
}